

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O3

ArrowTypeExtension * __thiscall
duckdb::DBConfig::GetArrowExtension
          (ArrowTypeExtension *__return_storage_ptr__,DBConfig *this,ArrowExtensionMetadata *info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  int iVar6;
  pthread_mutex_t *__mutex;
  pointer pAVar7;
  ArrowExtensionMetadata local_b0;
  
  __mutex = (pthread_mutex_t *)
            unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
            ::operator->(&this->arrow_extensions);
  iVar6 = pthread_mutex_lock(__mutex);
  if (iVar6 == 0) {
    pAVar7 = unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
             ::operator->(&this->arrow_extensions);
    paVar2 = &local_b0.extension_name.field_2;
    local_b0.extension_name._M_dataplus._M_p = (info->extension_name)._M_dataplus._M_p;
    paVar1 = &(info->extension_name).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.extension_name._M_dataplus._M_p == paVar1) {
      local_b0.extension_name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_b0.extension_name.field_2._8_8_ =
           *(undefined8 *)((long)&(info->extension_name).field_2 + 8);
      local_b0.extension_name._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_b0.extension_name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_b0.extension_name._M_string_length = (info->extension_name)._M_string_length;
    paVar3 = &local_b0.vendor_name.field_2;
    (info->extension_name)._M_dataplus._M_p = (pointer)paVar1;
    (info->extension_name)._M_string_length = 0;
    (info->extension_name).field_2._M_local_buf[0] = '\0';
    local_b0.vendor_name._M_dataplus._M_p = (info->vendor_name)._M_dataplus._M_p;
    paVar1 = &(info->vendor_name).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.vendor_name._M_dataplus._M_p == paVar1) {
      local_b0.vendor_name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_b0.vendor_name.field_2._8_8_ = *(undefined8 *)((long)&(info->vendor_name).field_2 + 8);
      local_b0.vendor_name._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_b0.vendor_name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_b0.vendor_name._M_string_length = (info->vendor_name)._M_string_length;
    paVar4 = &local_b0.type_name.field_2;
    (info->vendor_name)._M_dataplus._M_p = (pointer)paVar1;
    (info->vendor_name)._M_string_length = 0;
    (info->vendor_name).field_2._M_local_buf[0] = '\0';
    local_b0.type_name._M_dataplus._M_p = (info->type_name)._M_dataplus._M_p;
    paVar1 = &(info->type_name).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.type_name._M_dataplus._M_p == paVar1) {
      local_b0.type_name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_b0.type_name.field_2._8_8_ = *(undefined8 *)((long)&(info->type_name).field_2 + 8);
      local_b0.type_name._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_b0.type_name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_b0.type_name._M_string_length = (info->type_name)._M_string_length;
    paVar5 = &local_b0.arrow_format.field_2;
    (info->type_name)._M_dataplus._M_p = (pointer)paVar1;
    (info->type_name)._M_string_length = 0;
    (info->type_name).field_2._M_local_buf[0] = '\0';
    local_b0.arrow_format._M_dataplus._M_p = (info->arrow_format)._M_dataplus._M_p;
    paVar1 = &(info->arrow_format).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.arrow_format._M_dataplus._M_p == paVar1) {
      local_b0.arrow_format.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_b0.arrow_format.field_2._8_8_ = *(undefined8 *)((long)&(info->arrow_format).field_2 + 8)
      ;
      local_b0.arrow_format._M_dataplus._M_p = (pointer)paVar5;
    }
    else {
      local_b0.arrow_format.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_b0.arrow_format._M_string_length = (info->arrow_format)._M_string_length;
    (info->arrow_format)._M_dataplus._M_p = (pointer)paVar1;
    (info->arrow_format)._M_string_length = 0;
    (info->arrow_format).field_2._M_local_buf[0] = '\0';
    GetArrowExtensionInternal(__return_storage_ptr__,&pAVar7->type_extensions,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.arrow_format._M_dataplus._M_p != paVar5) {
      operator_delete(local_b0.arrow_format._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.type_name._M_dataplus._M_p != paVar4) {
      operator_delete(local_b0.type_name._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.vendor_name._M_dataplus._M_p != paVar3) {
      operator_delete(local_b0.vendor_name._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.extension_name._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0.extension_name._M_dataplus._M_p);
    }
    pthread_mutex_unlock(__mutex);
    return __return_storage_ptr__;
  }
  ::std::__throw_system_error(iVar6);
}

Assistant:

ArrowTypeExtension DBConfig::GetArrowExtension(ArrowExtensionMetadata info) const {
	lock_guard<mutex> l(arrow_extensions->lock);
	return GetArrowExtensionInternal(arrow_extensions->type_extensions, std::move(info));
}